

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer_allocator.cpp
# Opt level: O1

torrent_peer * __thiscall
libtorrent::aux::torrent_peer_allocator::allocate_peer_entry(torrent_peer_allocator *this,int type)

{
  void *ret;
  torrent_peer *ptVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (type == 2) {
    ptVar1 = (torrent_peer *)
             (this->m_i2p_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
    if (ptVar1 == (torrent_peer *)0x0) {
      ptVar1 = (torrent_peer *)
               boost::pool<libtorrent::aux::allocator_new_delete>::malloc_need_resize
                         (&this->m_i2p_peer_pool);
    }
    else {
      (this->m_i2p_peer_pool).super_simple_segregated_storage<unsigned_long>.first =
           *(void **)ptVar1;
    }
    if (ptVar1 != (torrent_peer *)0x0) {
      iVar2 = 0x28;
      lVar4 = 0x28;
      lVar3 = 0x98;
      lVar5 = 0xa0;
LAB_0037c42f:
      *(undefined8 *)
       ((long)&(this->super_torrent_peer_allocator_interface)._vptr_torrent_peer_allocator_interface
       + lVar5) = 500;
      *(undefined8 *)
       ((long)&(this->super_torrent_peer_allocator_interface)._vptr_torrent_peer_allocator_interface
       + lVar3) = 500;
      this->m_total_bytes = this->m_total_bytes + lVar4;
      this->m_live_bytes = this->m_live_bytes + iVar2;
      this->m_live_allocations = this->m_live_allocations + 1;
      this->m_total_allocations = this->m_total_allocations + 1;
      return ptVar1;
    }
  }
  else if (type == 1) {
    ptVar1 = (torrent_peer *)
             (this->m_ipv6_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
    if (ptVar1 == (torrent_peer *)0x0) {
      ptVar1 = (torrent_peer *)
               boost::pool<libtorrent::aux::allocator_new_delete>::malloc_need_resize
                         (&this->m_ipv6_peer_pool);
    }
    else {
      (this->m_ipv6_peer_pool).super_simple_segregated_storage<unsigned_long>.first =
           *(void **)ptVar1;
    }
    if (ptVar1 != (torrent_peer *)0x0) {
      iVar2 = 0x30;
      lVar4 = 0x30;
      lVar3 = 0x60;
      lVar5 = 0x68;
      goto LAB_0037c42f;
    }
  }
  else if (type == 0) {
    ptVar1 = (torrent_peer *)
             (this->m_ipv4_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
    if (ptVar1 == (torrent_peer *)0x0) {
      ptVar1 = (torrent_peer *)
               boost::pool<libtorrent::aux::allocator_new_delete>::malloc_need_resize
                         (&this->m_ipv4_peer_pool);
    }
    else {
      (this->m_ipv4_peer_pool).super_simple_segregated_storage<unsigned_long>.first =
           *(void **)ptVar1;
    }
    if (ptVar1 != (torrent_peer *)0x0) {
      iVar2 = 0x28;
      lVar3 = 0x28;
      lVar5 = 0x30;
      lVar4 = 0x28;
      goto LAB_0037c42f;
    }
  }
  return (torrent_peer *)0x0;
}

Assistant:

torrent_peer* torrent_peer_allocator::allocate_peer_entry(int type)
	{
		TORRENT_ASSERT(m_in_use);
		torrent_peer* p = nullptr;
		switch(type)
		{
			case torrent_peer_allocator_interface::ipv4_peer_type:
				p = static_cast<torrent_peer*>(m_ipv4_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv4_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(ipv4_peer);
				m_live_bytes += sizeof(ipv4_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
			case torrent_peer_allocator_interface::ipv6_peer_type:
				p = static_cast<torrent_peer*>(m_ipv6_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv6_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(ipv6_peer);
				m_live_bytes += sizeof(ipv6_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#if TORRENT_USE_I2P
			case torrent_peer_allocator_interface::i2p_peer_type:
				p = static_cast<torrent_peer*>(m_i2p_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_i2p_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(i2p_peer);
				m_live_bytes += sizeof(i2p_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#endif
#if TORRENT_USE_RTC
            case torrent_peer_allocator_interface::rtc_peer_type:
                p = static_cast<torrent_peer*>(m_rtc_peer_pool.malloc());
                if (p == nullptr) return nullptr;
                m_rtc_peer_pool.set_next_size(500);
                m_total_bytes += sizeof(rtc_peer);
                m_live_bytes += sizeof(rtc_peer);
                ++m_live_allocations;
                ++m_total_allocations;
                break;
#endif
		}
		return p;
	}